

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O1

void Undo_Justification(FIELD *field,WINDOW_conflict *win)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  
  pcVar1 = Get_Start_Of_Data(field->buf,field->dcols * field->drows);
  pcVar2 = After_End_Of_Data(field->buf,field->dcols * field->drows);
  iVar3 = (int)pcVar2 - (int)pcVar1;
  if (iVar3 < 1) {
    return;
  }
  if (win != (WINDOW_conflict *)0x0) {
    wmove(win,0,0);
    waddnstr(win,pcVar1,iVar3);
    return;
  }
  __assert_fail("win != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CursesDialog/form/frm_driver.c"
                ,0x31c,"void Undo_Justification(FIELD *, WINDOW *)");
}

Assistant:

static void Undo_Justification(FIELD  * field, WINDOW * win)
{
  char *bp;
  int len;

  bp  = Get_Start_Of_Data(field->buf,Buffer_Length(field));
  len = (int)(After_End_Of_Data(field->buf,Buffer_Length(field))-bp);

  if (len>0)
    {
      assert(win != 0);
      wmove(win,0,0);
      waddnstr(win,bp,len);
    }
}